

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Parser * __thiscall Parser::bracketOperatorFix(Parser *this,string *data)

{
  Instruction IVar1;
  ulong uVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  string *this_00;
  long lVar6;
  long lVar7;
  ulong in_RDX;
  bool bVar8;
  allocator local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [8];
  string newOperator;
  string local_d8 [32];
  string local_b8 [39];
  byte local_91;
  string local_90 [48];
  uint local_60;
  byte local_59;
  uint a;
  bool isQuoteOpen;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bracketOperators;
  uint currentLayer;
  string *data_local;
  Parser *this_local;
  string *returnValue;
  
  bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  std::
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&a);
  local_59 = 0;
  local_60 = 0;
  do {
    uVar5 = (ulong)local_60;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar5) {
      bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      std::
      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&a);
      if ((bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
        std::__cxx11::string::~string((string *)this);
      }
      return this;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDX);
    if (*pcVar3 == '\"') {
      local_59 = (local_59 ^ 0xff) & 1;
    }
    if (((local_59 & 1) == 0) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar3 == '(')) {
      bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      pmVar4 = std::
               map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&a,(key_type *)
                                  &bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count
                           );
      std::__cxx11::string::operator=((string *)pmVar4,"");
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDX);
      std::__cxx11::string::operator+=((string *)this,*pcVar3);
    }
    else if (((local_59 & 1) == 0) &&
            ((pcVar3 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar3 == ')' ||
             (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDX), *pcVar3 == ',')))) {
      std::
      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&a,(key_type *)
                         &bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)this,' ');
        pmVar4 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&a,(key_type *)
                                    &bracketOperators._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count);
        std::__cxx11::string::operator+=((string *)this,(string *)pmVar4);
      }
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDX);
      std::__cxx11::string::operator+=((string *)this,*pcVar3);
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDX);
      if (*pcVar3 == ')') {
        bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (int)bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count + -1;
      }
      else {
        std::
        map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&a,(key_type *)
                           &bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::clear();
      }
    }
    else {
      local_91 = 0;
      bVar8 = false;
      if ((local_59 & 1) == 0) {
        uVar5 = (ulong)local_60;
        uVar2 = std::__cxx11::string::size();
        bVar8 = false;
        if (uVar5 != uVar2) {
          std::__cxx11::string::substr((ulong)local_90,in_RDX);
          local_91 = 1;
          IVar1 = stringToInstruction(local_90);
          bVar8 = IVar1 != NONE;
        }
      }
      if ((local_91 & 1) != 0) {
        std::__cxx11::string::~string((string *)local_90);
      }
      if (bVar8) {
        std::__cxx11::string::substr((ulong)local_b8,in_RDX);
        pmVar4 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&a,(key_type *)
                                    &bracketOperators._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count);
        std::__cxx11::string::operator=((string *)pmVar4,local_b8);
        std::__cxx11::string::~string(local_b8);
        lVar6 = std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)this,lVar6 - 1);
        local_60 = local_60 + 1;
      }
      else {
        bVar8 = false;
        if ((local_59 & 1) == 0) {
          std::__cxx11::string::substr((ulong)local_d8,in_RDX);
          IVar1 = stringToInstruction(local_d8);
          bVar8 = IVar1 != NONE;
          std::__cxx11::string::~string((string *)local_d8);
        }
        if (bVar8) {
          std::__cxx11::string::substr((ulong)local_100,in_RDX);
          std::
          map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&a,(key_type *)
                             &bracketOperators._M_t._M_impl.super__Rb_tree_header._M_node_count);
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            pmVar4 = std::
                     map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&a,(key_type *)
                                        &bracketOperators._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
            bVar8 = std::operator!=(local_100,pmVar4);
            if (bVar8) {
              this_00 = (string *)__cxa_allocate_exception(0x20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (this_00,"Please only use one operator per bracket at the moment",&local_101
                        );
              __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
          }
          pmVar4 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&a,(key_type *)
                                      &bracketOperators._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
          std::__cxx11::string::operator=((string *)pmVar4,(string *)local_100);
          lVar6 = std::__cxx11::string::size();
          lVar7 = std::__cxx11::string::size();
          std::__cxx11::string::size();
          std::__cxx11::string::erase((ulong)this,lVar6 - lVar7);
          std::__cxx11::string::~string((string *)local_100);
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[](in_RDX);
          std::__cxx11::string::operator+=((string *)this,*pcVar3);
        }
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

std::string Parser::bracketOperatorFix(const std::string &data)
{
    //Convert things like "((1 + 2) + (3 * 4))" to "((1 2 +) (3 4 *) +)"

    std::string returnValue; //Store what the function will return as it's generated
    unsigned int currentLayer = 0; //To keep track of the current bracket layer
    std::map<unsigned int, std::string> bracketOperators; //Keep track of each bracket layer's operator. Map to keep track of multiple layers of brackets. map<LAYER, OPERATOR>
    bool isQuoteOpen = false;

    //Find operators and data
    for(unsigned int a = 0; a < data.size(); a++)
    {
        //If quotation marks
        if(data[a] == '"')
        {
            isQuoteOpen = !isQuoteOpen;
        }

        //If new bracket, update bracket layer and set the layer's default operator (+)
        if(!isQuoteOpen && data[a] == '(')
        {
            currentLayer++;
            bracketOperators[currentLayer] = "";
            returnValue += data[a];
        }

        //If we're exiting a bracket, update the layer and insert a space followed by this layer's operator
        else if(!isQuoteOpen && (data[a] == ')' || data[a] == ','))
        {
            if(!bracketOperators[currentLayer].empty()) //Only add operator to the end if there is one
            {
                returnValue += ' ';
                returnValue += bracketOperators[currentLayer];
            }
            returnValue += data[a];
            if(data[a] == ')')
                currentLayer--;
            else
                bracketOperators[currentLayer].clear();
        }

        //Else if dual-character operator. Temporary fix.
        else if(!isQuoteOpen && a != data.size() && stringToInstruction(data.substr(a, 2)) != Instruction::NONE)
        {
            bracketOperators[currentLayer] = data.substr(a, 2);
            returnValue.erase(returnValue.size()-1, 1);
            a++;
        }

        //Else if a single-character operator, don't add the operator to the return value and store this layer's operator
        else if(!isQuoteOpen && stringToInstruction(data.substr(a, 1)) != Instruction::NONE)
        {
            std::string newOperator = data.substr(a, 1);
            if(!bracketOperators[currentLayer].empty() && newOperator != bracketOperators[currentLayer])
            {
                throw std::string("Please only use one operator per bracket at the moment");
            }

            bracketOperators[currentLayer] = newOperator;
            returnValue.erase(returnValue.size()-newOperator.size(), newOperator.size());
        }

        //Else, store current character. Not important.
        else
        {
            returnValue += data[a];
        }
    }
    return returnValue;
}